

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O0

void __thiscall ExactFloat::ExactFloat(ExactFloat *this,int v)

{
  int iVar1;
  BIGNUM *a;
  ostream *poVar2;
  S2LogMessage local_38;
  S2LogMessageVoidify local_25 [17];
  int local_14;
  ExactFloat *pEStack_10;
  int v_local;
  ExactFloat *this_local;
  
  local_14 = v;
  pEStack_10 = this;
  BigNum::BigNum(&this->bn_);
  this->sign_ = local_14 >> 0x1f | 1;
  a = (BIGNUM *)BigNum::get(&this->bn_);
  iVar1 = local_14;
  if (local_14 < 1) {
    iVar1 = -local_14;
  }
  iVar1 = BN_set_word(a,(long)iVar1);
  if (iVar1 != 0) {
    this->bn_exp_ = 0;
    Canonicalize(this);
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
             ,0xb9,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_38);
  poVar2 = std::operator<<(poVar2,"Check failed: BN_set_word(bn_.get(), abs(v)) ");
  S2LogMessageVoidify::operator&(local_25,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
}

Assistant:

ExactFloat::ExactFloat(int v) {
  sign_ = (v >= 0) ? 1 : -1;
  // Note that this works even for INT_MIN because the parameter type for
  // BN_set_word() is unsigned.
  S2_CHECK(BN_set_word(bn_.get(), abs(v)));
  bn_exp_ = 0;
  Canonicalize();
}